

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O0

void labldump(FILE *fp)

{
  size_t sVar1;
  int local_24;
  t_symbol *ptStack_20;
  int i;
  t_symbol *local;
  t_symbol *sym;
  FILE *fp_local;
  
  fprintf((FILE *)fp,"Label\t\t\t\tAddr\tBank\n");
  fprintf((FILE *)fp,"-----\t\t\t\t----\t----\n");
  for (local_24 = 0; local_24 < 0x100; local_24 = local_24 + 1) {
    for (local = hash_tbl[local_24]; local != (t_symbol *)0x0; local = local->next) {
      fprintf((FILE *)fp,"%s\t",local->name + 1);
      sVar1 = strlen(local->name + 1);
      if (sVar1 < 8) {
        fprintf((FILE *)fp,"\t");
      }
      sVar1 = strlen(local->name + 1);
      if (sVar1 < 0x10) {
        fprintf((FILE *)fp,"\t");
      }
      sVar1 = strlen(local->name + 1);
      if (sVar1 < 0x18) {
        fprintf((FILE *)fp,"\t");
      }
      fprintf((FILE *)fp,"%4.4x\t %2.2x\n",(ulong)(uint)local->value,(ulong)(uint)local->bank);
      if (local->local != (t_symbol *)0x0) {
        for (ptStack_20 = local->local; ptStack_20 != (t_symbol *)0x0; ptStack_20 = ptStack_20->next
            ) {
          fprintf((FILE *)fp,"\t%s\t",ptStack_20->name + 1);
          sVar1 = strlen(ptStack_20->name + 1);
          if (sVar1 < 8) {
            fprintf((FILE *)fp,"\t");
          }
          sVar1 = strlen(ptStack_20->name + 1);
          if (sVar1 < 0x10) {
            fprintf((FILE *)fp,"\t");
          }
          fprintf((FILE *)fp,"%4.4x\t %2.2x\n",(ulong)(uint)ptStack_20->value,
                  (ulong)(uint)ptStack_20->bank);
        }
      }
    }
  }
  return;
}

Assistant:

void
labldump(FILE *fp)
{
	struct t_symbol *sym;
	struct t_symbol *local;
	int i;

	fprintf(fp, "Label\t\t\t\tAddr\tBank\n");
	fprintf(fp, "-----\t\t\t\t----\t----\n");

	/* browse the symbol table */
	for (i = 0; i < 256; i++) {
		sym = hash_tbl[i];
		while (sym) {
			/* dump the label */
			fprintf(fp, "%s\t", &(sym->name[1]));
			if (strlen(&(sym->name[1])) < 8)
				fprintf(fp, "\t");
			if (strlen(&(sym->name[1])) < 16)
				fprintf(fp, "\t");
			if (strlen(&(sym->name[1])) < 24)
				fprintf(fp, "\t");
			fprintf(fp, "%4.4x\t %2.2x\n", sym->value, sym->bank);

			/* local symbols */
			if (sym->local) {
				local = sym->local;

				while  (local) {
					fprintf(fp, "\t%s\t", &(local->name[1]));
					if (strlen(&(local->name[1])) < 8)
						fprintf(fp, "\t");
					if (strlen(&(local->name[1])) < 16)
						fprintf(fp, "\t");
					fprintf(fp, "%4.4x\t %2.2x\n", local->value, local->bank);

					/* next */
					local = local->next;
				}
			}

			/* next */
			sym = sym->next;
		}
	}
}